

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicNetwork.hpp
# Opt level: O1

void __thiscall
BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager>::Reset
          (BasicNetwork<LifNeuron,_LifSynapse,_PreciseEventManager> *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->super_INetwork).neuronMap._M_t._M_impl.super__Rb_tree_header._M_header.
                _M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->super_INetwork).neuronMap._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(*(long *)p_Var1[1]._M_parent + 0x28))();
  }
  return;
}

Assistant:

void BasicNetwork<Neuron, Synapse, EventManager>::Reset()
{
    for ( auto id_ptr : neuronMap ) {
        id_ptr.second->Reset();
    }
}